

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

bool __thiscall ParseContext::Consume(ParseContext *this,char *str)

{
  bool bVar1;
  InplaceStr local_40;
  InplaceStr local_30;
  char *local_20;
  char *str_local;
  ParseContext *this_local;
  
  local_20 = str;
  str_local = (char *)this;
  InplaceStr::InplaceStr(&local_30,this->currentLexeme->pos,this->currentLexeme->length);
  InplaceStr::InplaceStr(&local_40,local_20);
  bVar1 = InplaceStr::operator==(&local_30,&local_40);
  if (bVar1) {
    Skip(this);
  }
  return bVar1;
}

Assistant:

bool ParseContext::Consume(const char *str)
{
	if(InplaceStr(currentLexeme->pos, currentLexeme->length) == InplaceStr(str))
	{
		Skip();
		return true;
	}

	return false;
}